

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::set_empty_key(dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *this,key_type *key)

{
  pointer piVar1;
  const_pointer in_RSI;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *in_RDI;
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *unaff_retaddr;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *table_start;
  
  table_start = in_RDI;
  sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
  set_use_empty(in_RDI,true);
  *(int *)&in_RDI[1].enlarge_threshold_ = *in_RSI;
  piVar1 = Alloc<int,_unsigned_long,_18446744073709551615UL>::allocate
                     ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)unaff_retaddr,
                      (size_type)table_start,in_RSI);
  in_RDI[2].enlarge_threshold_ = (size_type)piVar1;
  fill_range_with_empty(unaff_retaddr,(pointer)table_start,(size_type)in_RSI);
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }